

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

bool MallocBlock::CheckEverything(void)

{
  FunctionRef<void_(const_void_*,_int_*)> body;
  undefined1 local_9;
  
  SpinLock::Lock(&alloc_map_lock_);
  if (alloc_map_ != (AllocMap *)0x0) {
    body.data = &local_9;
    body.fn = anon_func::anon_class_1_0_00000001::__invoke;
    AddressMap<int>::Iterate(alloc_map_,body);
  }
  SpinLock::Unlock(&alloc_map_lock_);
  return true;
}

Assistant:

static bool CheckEverything() {
    alloc_map_lock_.Lock();
    if (alloc_map_) {
      alloc_map_->Iterate([] (const void* ptr, int* type) {
        if ((*type & kDeallocatedTypeBit) == 0) {
          FromRawPointer(ptr)->CheckLocked(*type);
        }
      });
    }
    alloc_map_lock_.Unlock();
    return true;  // if we get here, we're okay
  }